

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx2::SubdivPatch1MBIntersectorK<4>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 uVar8;
  BVH *bvh;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar16;
  undefined1 auVar17 [16];
  uint uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [12];
  long lVar24;
  vint<4> vVar25;
  uint uVar26;
  int iVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  long lVar29;
  undefined4 uVar30;
  GridSOA *pGVar31;
  size_t sVar32;
  long lVar33;
  ulong uVar34;
  long lVar35;
  Primitive_conflict3 *prim;
  NodeRef root;
  ulong uVar36;
  long lVar37;
  GridSOA *pGVar38;
  ulong uVar39;
  GridSOA *pGVar40;
  uint uVar41;
  long lVar42;
  long lVar43;
  GridSOA *pGVar44;
  NodeRef *pNVar45;
  ulong uVar46;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar47;
  bool bVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar65;
  undefined1 in_ZMM0 [64];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  vint4 ai;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  vint4 ai_1;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  vint4 ai_3;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  vint4 bi;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vint4 ai_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  vint4 bi_1;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  vint4 bi_3;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  vint4 bi_2;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float fVar186;
  float fVar187;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar195;
  undefined1 auVar190 [16];
  float fVar196;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [64];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [64];
  undefined1 local_1c78 [16];
  undefined1 local_1c68 [8];
  float fStack_1c60;
  undefined4 uStack_1c5c;
  undefined1 local_1c28 [16];
  undefined1 local_1bd8 [16];
  Intersectors *local_1bc8;
  RayK<4> *local_1bc0;
  GridSOA *local_1bb8;
  GridSOA *local_1bb0;
  GridSOA *local_1ba8;
  GridSOA *local_1ba0;
  GridSOA *local_1b98;
  GridSOA *local_1b90;
  GridSOA *local_1b88;
  int local_1b7c;
  undefined1 local_1b78 [16];
  undefined1 local_1b68 [16];
  undefined1 local_1b58 [16];
  undefined1 local_1b48 [16];
  vbool<4> terminated;
  Precalculations pre;
  long local_1b08;
  GridSOA *local_1b00;
  GridSOA *local_1af8;
  GridSOA *local_1af0;
  RTCFilterFunctionNArguments args;
  undefined1 local_1a98 [8];
  undefined8 uStack_1a90;
  float local_1a68;
  float fStack_1a64;
  float fStack_1a60;
  float local_1a18;
  float fStack_1a14;
  float fStack_1a10;
  float fStack_1a0c;
  vint<4> vitime;
  undefined8 local_19f8;
  undefined8 uStack_19f0;
  undefined8 local_19e8;
  undefined8 uStack_19e0;
  undefined8 local_19d8;
  undefined8 uStack_19d0;
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  undefined1 local_19a8 [16];
  undefined1 local_1998 [16];
  uint local_1988;
  uint uStack_1984;
  uint uStack_1980;
  uint uStack_197c;
  uint uStack_1978;
  uint uStack_1974;
  uint uStack_1970;
  uint uStack_196c;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 local_1968;
  undefined1 local_1958 [16];
  longlong local_1948;
  longlong lStack_1940;
  undefined1 local_1938 [16];
  undefined1 local_1928 [16];
  undefined1 local_1918 [16];
  undefined1 local_1908 [16];
  undefined1 local_18f8 [16];
  undefined1 local_18e8 [16];
  undefined1 local_18d8 [16];
  undefined1 local_18c8 [16];
  undefined1 local_18b8 [8];
  float fStack_18b0;
  float fStack_18ac;
  undefined1 local_18a8 [8];
  float fStack_18a0;
  float fStack_189c;
  undefined1 local_1898 [16];
  undefined1 local_1888 [16];
  undefined1 local_1878 [16];
  undefined1 local_1868 [16];
  undefined8 local_1858;
  undefined8 uStack_1850;
  undefined1 local_1848 [8];
  float fStack_1840;
  float fStack_183c;
  undefined1 local_1838 [8];
  float fStack_1830;
  float fStack_182c;
  undefined1 local_1828 [16];
  undefined1 local_1818 [16];
  undefined1 local_1808 [16];
  undefined1 local_17f8 [16];
  TravRayK<4,_false> tray;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    auVar66 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar126 = vpcmpeqd_avx(auVar66,(undefined1  [16])valid_i->field_0);
    auVar58 = ZEXT816(0) << 0x40;
    auVar111 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar58,5);
    auVar80 = auVar126 & auVar111;
    if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar80 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar80 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar80[0xf] < '\0')
    {
      pre.super_Precalculations.grid = (GridSOA *)0x0;
      local_1958 = vandps_avx(auVar111,auVar126);
      tray.org.field_0._0_4_ = *(float *)ray;
      tray.org.field_0._4_4_ = *(float *)(ray + 4);
      tray.org.field_0._8_4_ = *(float *)(ray + 8);
      tray.org.field_0._12_4_ = *(float *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(float *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(float *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(float *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(float *)(ray + 0x1c);
      tray.org.field_0._32_4_ = *(float *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(float *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(float *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(float *)(ray + 0x2c);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar201._8_4_ = 0x7fffffff;
      auVar201._0_8_ = 0x7fffffff7fffffff;
      auVar201._12_4_ = 0x7fffffff;
      auVar111 = vandps_avx(auVar201,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar197._8_4_ = 0x219392ef;
      auVar197._0_8_ = 0x219392ef219392ef;
      auVar197._12_4_ = 0x219392ef;
      auVar111 = vcmpps_avx(auVar111,auVar197,1);
      auVar126 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.x.field_0,auVar197,
                               auVar111);
      auVar111 = vandps_avx(auVar201,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar111 = vcmpps_avx(auVar111,auVar197,1);
      auVar80 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.y.field_0,auVar197,auVar111
                             );
      auVar111 = vandps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar201);
      auVar111 = vcmpps_avx(auVar111,auVar197,1);
      auVar111 = vblendvps_avx((undefined1  [16])tray.dir.field_0.field_0.z.field_0,auVar197,
                               auVar111);
      auVar154 = vrcpps_avx(auVar126);
      auVar198._8_4_ = 0x3f800000;
      auVar198._0_8_ = &DAT_3f8000003f800000;
      auVar198._12_4_ = 0x3f800000;
      auVar126 = vfnmadd213ps_fma(auVar126,auVar154,auVar198);
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar126,auVar154,auVar154);
      auVar126 = vrcpps_avx(auVar80);
      auVar80 = vfnmadd213ps_fma(auVar80,auVar126,auVar198);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar80,auVar126,auVar126);
      auVar126 = vrcpps_avx(auVar111);
      auVar111 = vfnmadd213ps_fma(auVar111,auVar126,auVar198);
      tray.rdir.field_0.field_0.z.field_0 =
           (vfloat_impl<4>)vfmadd132ps_fma(auVar111,auVar126,auVar126);
      tray.org_rdir.field_0._0_4_ = tray.rdir.field_0._0_4_ * *(float *)ray;
      tray.org_rdir.field_0._4_4_ = tray.rdir.field_0._4_4_ * *(float *)(ray + 4);
      tray.org_rdir.field_0._8_4_ = tray.rdir.field_0._8_4_ * *(float *)(ray + 8);
      tray.org_rdir.field_0._12_4_ = tray.rdir.field_0._12_4_ * *(float *)(ray + 0xc);
      tray.org_rdir.field_0._16_4_ = *(float *)(ray + 0x10) * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = *(float *)(ray + 0x14) * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = *(float *)(ray + 0x18) * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = *(float *)(ray + 0x1c) * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = *(float *)(ray + 0x20) * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = *(float *)(ray + 0x24) * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = *(float *)(ray + 0x28) * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = *(float *)(ray + 0x2c) * tray.rdir.field_0._44_4_;
      auVar111 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar58,1);
      auVar126._8_4_ = 0x10;
      auVar126._0_8_ = 0x1000000010;
      auVar126._12_4_ = 0x10;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar111,auVar126);
      auVar111 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar58,5);
      auVar80._8_4_ = 0x20;
      auVar80._0_8_ = 0x2000000020;
      auVar80._12_4_ = 0x20;
      auVar59._8_4_ = 0x30;
      auVar59._0_8_ = 0x3000000030;
      auVar59._12_4_ = 0x30;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar59,auVar80,auVar111)
      ;
      auVar111 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar58,5);
      auVar154._8_4_ = 0x40;
      auVar154._0_8_ = 0x4000000040;
      auVar154._12_4_ = 0x40;
      auVar67._8_4_ = 0x50;
      auVar67._0_8_ = 0x5000000050;
      auVar67._12_4_ = 0x50;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar67,auVar154,auVar111);
      auVar111 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar58);
      auVar126 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar58);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar212 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx((undefined1  [16])stack_near[0].field_0,auVar111,local_1958);
      auVar111._8_4_ = 0xff800000;
      auVar111._0_8_ = 0xff800000ff800000;
      auVar111._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vblendvps_avx(auVar111,auVar126,local_1958);
      terminated.field_0.i[1] = local_1958._4_4_ ^ auVar66._4_4_;
      terminated.field_0.i[0] = local_1958._0_4_ ^ auVar66._0_4_;
      terminated.field_0.i[2] = local_1958._8_4_ ^ auVar66._8_4_;
      terminated.field_0.i[3] = local_1958._12_4_ ^ auVar66._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar41 = 3;
      }
      else {
        uVar41 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      local_1bc0 = ray + 0x80;
      pNVar45 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar47 = &stack_near[2].field_0;
      stack_node[1].ptr = (bvh->root).ptr;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      local_1968 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)mm_lookupmask_ps._0_16_;
      local_1bc8 = This;
      do {
        paVar47 = paVar47 + -1;
        root.ptr = pNVar45[-1].ptr;
        pNVar45 = pNVar45 + -1;
        if (root.ptr == 0xfffffffffffffff8) {
LAB_00550a7e:
          iVar27 = 3;
        }
        else {
          aVar65 = *paVar47;
          auVar111 = vcmpps_avx((undefined1  [16])aVar65,(undefined1  [16])tray.tfar.field_0,1);
          uVar26 = vmovmskps_avx(auVar111);
          if (uVar26 == 0) {
LAB_00550a8f:
            iVar27 = 2;
          }
          else {
            uVar36 = (ulong)(uVar26 & 0xff);
            uVar26 = POPCOUNT(uVar26 & 0xff);
            iVar27 = 0;
            if (uVar26 <= uVar41) {
              do {
                sVar32 = 0;
                for (uVar28 = uVar36; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000)
                {
                  sVar32 = sVar32 + 1;
                }
                bVar48 = occluded1(local_1bc8,bvh,root,sVar32,&pre,ray,&tray,context);
                if (bVar48) {
                  terminated.field_0.i[sVar32] = -1;
                }
                uVar36 = uVar36 - 1 & uVar36;
              } while (uVar36 != 0);
              auVar111 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
              iVar27 = 3;
              auVar212 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
              if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar111[0xf] < '\0') {
                auVar66._8_4_ = 0xff800000;
                auVar66._0_8_ = 0xff800000ff800000;
                auVar66._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar66,
                                   (undefined1  [16])terminated.field_0);
                iVar27 = 2;
              }
            }
            auVar208 = ZEXT1664((undefined1  [16])aVar65);
            if (uVar41 < uVar26) {
              do {
                uVar26 = (uint)root.ptr;
                if ((root.ptr & 8) != 0) {
                  if (root.ptr == 0xfffffffffffffff8) goto LAB_00550a7e;
                  auVar111 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar208._0_16_,6);
                  if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar111 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar111 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar111[0xf] < '\0') {
                    if ((uVar26 & 0xf) == 8) {
                      fVar84 = (float)(*(int *)(pre.super_Precalculations.grid + 8) - 1);
                      auVar58._0_4_ = fVar84 * *(float *)(ray + 0x70);
                      auVar58._4_4_ = fVar84 * *(float *)(ray + 0x74);
                      auVar58._8_4_ = fVar84 * *(float *)(ray + 0x78);
                      auVar58._12_4_ = fVar84 * *(float *)(ray + 0x7c);
                      auVar111 = vroundps_avx(auVar58,1);
                      fVar84 = fVar84 + -1.0;
                      auVar86._4_4_ = fVar84;
                      auVar86._0_4_ = fVar84;
                      auVar86._8_4_ = fVar84;
                      auVar86._12_4_ = fVar84;
                      auVar111 = vminps_avx(auVar111,auVar86);
                      auVar111 = vmaxps_avx(auVar111,_DAT_01feba10);
                      vitime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar111);
                      vVar25.field_0 = vitime.field_0;
                      uVar26 = vmovmskps_avx((undefined1  [16])terminated.field_0);
                      uVar26 = uVar26 ^ 0xf;
                      aVar16 = terminated.field_0;
                      if (uVar26 != 0) {
                        auVar111 = vsubps_avx(auVar58,auVar111);
                        auVar87._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                        auVar87._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                        auVar87._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                        auVar49._8_4_ = 0x3f800000;
                        auVar49._0_8_ = &DAT_3f8000003f800000;
                        auVar49._12_4_ = 0x3f800000;
                        auVar66 = vsubps_avx(auVar49,auVar111);
                        local_1948 = vitime.field_0.v[0];
                        lStack_1940 = vitime.field_0.v[1];
                        uVar36 = root.ptr >> 2 & 0xfffffffffffffffc;
                        vitime.field_0 = vVar25.field_0;
                        auVar126 = auVar87;
                        do {
                          local_1918 = auVar87;
                          uVar18 = 0;
                          for (uVar26 = uVar26 & 0xff; (uVar26 & 1) == 0;
                              uVar26 = uVar26 >> 1 | 0x80000000) {
                            uVar18 = uVar18 + 1;
                          }
                          iVar27 = vitime.field_0.i[uVar18];
                          uVar39 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x14);
                          uVar46 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0xc);
                          uVar28 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x24);
                          lVar43 = (ulong)*(uint *)(pre.super_Precalculations.grid + 0x28) *
                                   (long)iVar27;
                          uVar34 = (ulong)(*(uint *)(pre.super_Precalculations.grid + 0x28) &
                                          0xfffffffc);
                          lVar42 = uVar34 + uVar28 + lVar43;
                          lVar37 = uVar39 * 0xc + lVar42;
                          pGVar31 = pre.super_Precalculations.grid + lVar37 + uVar46 * 4 + uVar36;
                          lVar33 = lVar43 + uVar39 * 8 + uVar28;
                          lVar35 = uVar34 + lVar33;
                          local_1b88 = pre.super_Precalculations.grid + lVar35 + uVar46 * 4 + uVar36
                          ;
                          lVar1 = lVar42 + uVar39 * 4;
                          local_1b90 = pre.super_Precalculations.grid + lVar1 + uVar46 * 4 + uVar36;
                          local_1b98 = pre.super_Precalculations.grid + lVar42 + uVar46 * 4 + uVar36
                          ;
                          lVar24 = uVar36 + 0x30;
                          local_1ba0 = pre.super_Precalculations.grid +
                                       uVar28 + lVar43 + uVar46 * 4 + lVar24;
                          local_1ba8 = pre.super_Precalculations.grid + lVar33 + uVar46 * 4 + lVar24
                          ;
                          lVar29 = lVar43 + uVar39 * 4 + uVar28;
                          local_1bb0 = pre.super_Precalculations.grid + lVar29 + uVar46 * 4 + lVar24
                          ;
                          pGVar40 = pre.super_Precalculations.grid + lVar37 + lVar24;
                          pGVar38 = pre.super_Precalculations.grid + lVar35 + lVar24;
                          local_1bb8 = pre.super_Precalculations.grid + lVar1 + lVar24;
                          local_1af0 = pre.super_Precalculations.grid + lVar42 + lVar24;
                          local_1af8 = pre.super_Precalculations.grid + lVar33 + lVar24;
                          local_1b00 = pre.super_Precalculations.grid + lVar29 + lVar24;
                          auVar50._4_4_ = iVar27;
                          auVar50._0_4_ = iVar27;
                          auVar50._8_4_ = iVar27;
                          auVar50._12_4_ = iVar27;
                          auVar17._8_8_ = lStack_1940;
                          auVar17._0_8_ = local_1948;
                          auVar80 = vpcmpeqd_avx(auVar50,auVar17);
                          local_1928 = vpand_avx(auVar80,auVar126);
                          local_1938 = local_1928 ^ _DAT_01febe20;
                          pGVar44 = pre.super_Precalculations.grid + lVar43;
                          local_1b7c = *(int *)(pre.super_Precalculations.grid + 0x10);
                          lVar1 = uVar46 * 4;
                          auVar208 = ZEXT1664(local_1928);
                          local_1b08 = 0;
                          do {
                            lVar24 = uVar28 + 0x2c + uVar36;
                            lVar29 = 0;
                            do {
                              if ((ulong)(uVar46 != 2) * 4 + 4 == lVar29) break;
                              uVar30 = *(undefined4 *)(pGVar44 + lVar29 + lVar24);
                              auVar159._4_4_ = uVar30;
                              auVar159._0_4_ = uVar30;
                              auVar159._8_4_ = uVar30;
                              auVar159._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(local_1b00 + lVar29 + -4);
                              auVar170._4_4_ = uVar30;
                              auVar170._0_4_ = uVar30;
                              auVar170._8_4_ = uVar30;
                              auVar170._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(local_1af8 + lVar29 + -4);
                              auVar178._4_4_ = uVar30;
                              auVar178._0_4_ = uVar30;
                              auVar178._8_4_ = uVar30;
                              auVar178._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(pGVar44 + lVar29 + lVar24 + 4);
                              auVar183._4_4_ = uVar30;
                              auVar183._0_4_ = uVar30;
                              auVar183._8_4_ = uVar30;
                              auVar183._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(local_1b00 + lVar29);
                              auVar145._4_4_ = uVar30;
                              auVar145._0_4_ = uVar30;
                              auVar145._8_4_ = uVar30;
                              auVar145._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(local_1af8 + lVar29);
                              auVar88._4_4_ = uVar30;
                              auVar88._0_4_ = uVar30;
                              auVar88._8_4_ = uVar30;
                              auVar88._12_4_ = uVar30;
                              local_1c28._4_4_ = *(undefined4 *)(local_1ba0 + lVar29 + -4);
                              local_1c28._0_4_ = local_1c28._4_4_;
                              local_1c28._8_4_ = local_1c28._4_4_;
                              local_1c28._12_4_ = local_1c28._4_4_;
                              local_1c68._4_4_ = *(undefined4 *)(local_1bb0 + lVar29 + -4);
                              local_1c68._0_4_ = local_1c68._4_4_;
                              fStack_1c60 = (float)local_1c68._4_4_;
                              uStack_1c5c = local_1c68._4_4_;
                              local_1c78._4_4_ = *(undefined4 *)(local_1ba8 + lVar29 + -4);
                              local_1c78._0_4_ = local_1c78._4_4_;
                              local_1c78._8_4_ = local_1c78._4_4_;
                              local_1c78._12_4_ = local_1c78._4_4_;
                              fVar84 = *(float *)(local_1af0 + lVar29 + -4);
                              fVar2 = *(float *)(local_1bb8 + lVar29 + -4);
                              auVar67 = auVar208._0_16_;
                              fVar3 = *(float *)(pGVar38 + lVar29 + -4);
                              fVar4 = *(float *)(local_1af0 + lVar29);
                              fVar5 = *(float *)(local_1bb8 + lVar29);
                              fVar6 = *(float *)(pGVar38 + lVar29);
                              fVar7 = *(float *)(local_1b98 + lVar29 + 0x2c);
                              local_1a18 = auVar111._0_4_;
                              fStack_1a14 = auVar111._4_4_;
                              fStack_1a10 = auVar111._8_4_;
                              fStack_1a0c = auVar111._12_4_;
                              auVar115._0_4_ = local_1a18 * fVar84;
                              auVar115._4_4_ = fStack_1a14 * fVar84;
                              auVar115._8_4_ = fStack_1a10 * fVar84;
                              auVar115._12_4_ = fStack_1a0c * fVar84;
                              auVar59 = vfmadd231ps_fma(auVar115,auVar66,auVar159);
                              fVar84 = *(float *)(local_1b90 + lVar29 + 0x2c);
                              auVar188._0_4_ = local_1a18 * fVar2;
                              auVar188._4_4_ = fStack_1a14 * fVar2;
                              auVar188._8_4_ = fStack_1a10 * fVar2;
                              auVar188._12_4_ = fStack_1a0c * fVar2;
                              auVar198 = vfmadd231ps_fma(auVar188,auVar66,auVar170);
                              fVar2 = *(float *)(local_1b88 + lVar29 + 0x2c);
                              auVar68._0_4_ = local_1a18 * fVar3;
                              auVar68._4_4_ = fStack_1a14 * fVar3;
                              auVar68._8_4_ = fStack_1a10 * fVar3;
                              auVar68._12_4_ = fStack_1a0c * fVar3;
                              auVar86 = vfmadd231ps_fma(auVar68,auVar66,auVar178);
                              auVar130._0_4_ = local_1a18 * fVar4;
                              auVar130._4_4_ = fStack_1a14 * fVar4;
                              auVar130._8_4_ = fStack_1a10 * fVar4;
                              auVar130._12_4_ = fStack_1a0c * fVar4;
                              auVar202._0_4_ = local_1a18 * fVar5;
                              auVar202._4_4_ = fStack_1a14 * fVar5;
                              auVar202._8_4_ = fStack_1a10 * fVar5;
                              auVar202._12_4_ = fStack_1a0c * fVar5;
                              auVar179._0_4_ = local_1a18 * fVar6;
                              auVar179._4_4_ = fStack_1a14 * fVar6;
                              auVar179._8_4_ = fStack_1a10 * fVar6;
                              auVar179._12_4_ = fStack_1a0c * fVar6;
                              auVar130 = vfmadd231ps_fma(auVar130,auVar66,auVar183);
                              local_17f8 = vfmadd231ps_fma(auVar202,auVar66,auVar145);
                              auVar145 = vfmadd231ps_fma(auVar179,auVar66,auVar88);
                              auVar209._0_4_ = local_1a18 * fVar7;
                              auVar209._4_4_ = fStack_1a14 * fVar7;
                              auVar209._8_4_ = fStack_1a10 * fVar7;
                              auVar209._12_4_ = fStack_1a0c * fVar7;
                              auVar89._0_4_ = local_1a18 * fVar84;
                              auVar89._4_4_ = fStack_1a14 * fVar84;
                              auVar89._8_4_ = fStack_1a10 * fVar84;
                              auVar89._12_4_ = fStack_1a0c * fVar84;
                              auVar160._0_4_ = local_1a18 * fVar2;
                              auVar160._4_4_ = fStack_1a14 * fVar2;
                              auVar160._8_4_ = fStack_1a10 * fVar2;
                              auVar160._12_4_ = fStack_1a0c * fVar2;
                              local_1808 = vfmadd231ps_fma(auVar209,auVar66,local_1c28);
                              local_1818 = vfmadd231ps_fma(auVar89,auVar66,_local_1c68);
                              local_1828 = vfmadd231ps_fma(auVar160,auVar66,local_1c78);
                              auVar80 = *(undefined1 (*) [16])ray;
                              auVar58 = *(undefined1 (*) [16])(ray + 0x10);
                              auVar154 = *(undefined1 (*) [16])(ray + 0x20);
                              auVar197 = vsubps_avx(auVar59,auVar80);
                              auVar198 = vsubps_avx(auVar198,auVar58);
                              auVar86 = vsubps_avx(auVar86,auVar154);
                              auVar87 = vsubps_avx(local_1818,auVar58);
                              auVar49 = vsubps_avx(local_1828,auVar154);
                              auVar17 = vsubps_avx(auVar87,auVar198);
                              auVar50 = vsubps_avx(auVar49,auVar86);
                              auVar90._0_4_ = auVar87._0_4_ + auVar198._0_4_;
                              auVar90._4_4_ = auVar87._4_4_ + auVar198._4_4_;
                              auVar90._8_4_ = auVar87._8_4_ + auVar198._8_4_;
                              auVar90._12_4_ = auVar87._12_4_ + auVar198._12_4_;
                              fVar84 = auVar86._0_4_;
                              auVar116._0_4_ = auVar49._0_4_ + fVar84;
                              fVar2 = auVar86._4_4_;
                              auVar116._4_4_ = auVar49._4_4_ + fVar2;
                              fVar3 = auVar86._8_4_;
                              auVar116._8_4_ = auVar49._8_4_ + fVar3;
                              fVar4 = auVar86._12_4_;
                              auVar116._12_4_ = auVar49._12_4_ + fVar4;
                              auVar205._0_4_ = auVar90._0_4_ * auVar50._0_4_;
                              auVar205._4_4_ = auVar90._4_4_ * auVar50._4_4_;
                              auVar205._8_4_ = auVar90._8_4_ * auVar50._8_4_;
                              auVar205._12_4_ = auVar90._12_4_ * auVar50._12_4_;
                              auVar115 = vfmsub231ps_fma(auVar205,auVar17,auVar116);
                              auVar68 = vsubps_avx(local_1808,auVar80);
                              auVar88 = vsubps_avx(auVar68,auVar197);
                              auVar189._0_4_ = auVar116._0_4_ * auVar88._0_4_;
                              auVar189._4_4_ = auVar116._4_4_ * auVar88._4_4_;
                              auVar189._8_4_ = auVar116._8_4_ * auVar88._8_4_;
                              auVar189._12_4_ = auVar116._12_4_ * auVar88._12_4_;
                              auVar117._0_4_ = auVar68._0_4_ + auVar197._0_4_;
                              auVar117._4_4_ = auVar68._4_4_ + auVar197._4_4_;
                              auVar117._8_4_ = auVar68._8_4_ + auVar197._8_4_;
                              auVar117._12_4_ = auVar68._12_4_ + auVar197._12_4_;
                              auVar59 = vfmsub231ps_fma(auVar189,auVar50,auVar117);
                              auVar118._0_4_ = auVar117._0_4_ * auVar17._0_4_;
                              auVar118._4_4_ = auVar117._4_4_ * auVar17._4_4_;
                              auVar118._8_4_ = auVar117._8_4_ * auVar17._8_4_;
                              auVar118._12_4_ = auVar117._12_4_ * auVar17._12_4_;
                              auVar89 = vfmsub231ps_fma(auVar118,auVar88,auVar90);
                              fVar187 = *(float *)(ray + 0x60);
                              fVar192 = *(float *)(ray + 100);
                              fVar194 = *(float *)(ray + 0x68);
                              auVar23 = *(undefined1 (*) [12])(ray + 0x60);
                              fVar196 = *(float *)(ray + 0x6c);
                              auVar119._0_4_ = fVar187 * auVar89._0_4_;
                              auVar119._4_4_ = fVar192 * auVar89._4_4_;
                              auVar119._8_4_ = fVar194 * auVar89._8_4_;
                              auVar119._12_4_ = fVar196 * auVar89._12_4_;
                              local_1b78 = *(undefined1 (*) [16])(ray + 0x50);
                              auVar89 = vfmadd231ps_fma(auVar119,local_1b78,auVar59);
                              auVar59 = *(undefined1 (*) [16])(ray + 0x40);
                              auVar116 = vfmadd231ps_fma(auVar89,auVar59,auVar115);
                              auVar80 = vsubps_avx(auVar130,auVar80);
                              auVar58 = vsubps_avx(local_17f8,auVar58);
                              auVar154 = vsubps_avx(auVar145,auVar154);
                              auVar89 = vsubps_avx(auVar198,auVar58);
                              auVar86 = vsubps_avx(auVar86,auVar154);
                              auVar146._0_4_ = auVar198._0_4_ + auVar58._0_4_;
                              auVar146._4_4_ = auVar198._4_4_ + auVar58._4_4_;
                              auVar146._8_4_ = auVar198._8_4_ + auVar58._8_4_;
                              auVar146._12_4_ = auVar198._12_4_ + auVar58._12_4_;
                              auVar203._0_4_ = fVar84 + auVar154._0_4_;
                              auVar203._4_4_ = fVar2 + auVar154._4_4_;
                              auVar203._8_4_ = fVar3 + auVar154._8_4_;
                              auVar203._12_4_ = fVar4 + auVar154._12_4_;
                              fVar186 = auVar86._0_4_;
                              auVar161._0_4_ = fVar186 * auVar146._0_4_;
                              fVar191 = auVar86._4_4_;
                              auVar161._4_4_ = fVar191 * auVar146._4_4_;
                              fVar193 = auVar86._8_4_;
                              auVar161._8_4_ = fVar193 * auVar146._8_4_;
                              fVar195 = auVar86._12_4_;
                              auVar161._12_4_ = fVar195 * auVar146._12_4_;
                              auVar117 = vfmsub231ps_fma(auVar161,auVar89,auVar203);
                              auVar115 = vsubps_avx(auVar197,auVar80);
                              fVar5 = auVar115._0_4_;
                              auVar204._0_4_ = auVar203._0_4_ * fVar5;
                              fVar7 = auVar115._4_4_;
                              auVar204._4_4_ = auVar203._4_4_ * fVar7;
                              fVar12 = auVar115._8_4_;
                              auVar204._8_4_ = auVar203._8_4_ * fVar12;
                              fVar14 = auVar115._12_4_;
                              auVar204._12_4_ = auVar203._12_4_ * fVar14;
                              auVar171._0_4_ = auVar197._0_4_ + auVar80._0_4_;
                              auVar171._4_4_ = auVar197._4_4_ + auVar80._4_4_;
                              auVar171._8_4_ = auVar197._8_4_ + auVar80._8_4_;
                              auVar171._12_4_ = auVar197._12_4_ + auVar80._12_4_;
                              auVar90 = vfmsub231ps_fma(auVar204,auVar86,auVar171);
                              fVar6 = auVar89._0_4_;
                              auVar172._0_4_ = auVar171._0_4_ * fVar6;
                              fVar11 = auVar89._4_4_;
                              auVar172._4_4_ = auVar171._4_4_ * fVar11;
                              fVar13 = auVar89._8_4_;
                              auVar172._8_4_ = auVar171._8_4_ * fVar13;
                              fVar15 = auVar89._12_4_;
                              auVar172._12_4_ = auVar171._12_4_ * fVar15;
                              auVar51 = vfmsub231ps_fma(auVar172,auVar115,auVar146);
                              auVar147._0_4_ = fVar187 * auVar51._0_4_;
                              auVar147._4_4_ = fVar192 * auVar51._4_4_;
                              auVar147._8_4_ = fVar194 * auVar51._8_4_;
                              auVar147._12_4_ = fVar196 * auVar51._12_4_;
                              auVar90 = vfmadd231ps_fma(auVar147,local_1b78,auVar90);
                              auVar117 = vfmadd231ps_fma(auVar90,auVar59,auVar117);
                              auVar90 = vsubps_avx(auVar80,auVar68);
                              auVar51._0_4_ = auVar68._0_4_ + auVar80._0_4_;
                              auVar51._4_4_ = auVar68._4_4_ + auVar80._4_4_;
                              auVar51._8_4_ = auVar68._8_4_ + auVar80._8_4_;
                              auVar51._12_4_ = auVar68._12_4_ + auVar80._12_4_;
                              auVar68 = vsubps_avx(auVar58,auVar87);
                              auVar69._0_4_ = auVar87._0_4_ + auVar58._0_4_;
                              auVar69._4_4_ = auVar87._4_4_ + auVar58._4_4_;
                              auVar69._8_4_ = auVar87._8_4_ + auVar58._8_4_;
                              auVar69._12_4_ = auVar87._12_4_ + auVar58._12_4_;
                              auVar87 = vsubps_avx(auVar154,auVar49);
                              auVar91._0_4_ = auVar154._0_4_ + auVar49._0_4_;
                              auVar91._4_4_ = auVar154._4_4_ + auVar49._4_4_;
                              auVar91._8_4_ = auVar154._8_4_ + auVar49._8_4_;
                              auVar91._12_4_ = auVar154._12_4_ + auVar49._12_4_;
                              auVar131._0_4_ = auVar87._0_4_ * auVar69._0_4_;
                              auVar131._4_4_ = auVar87._4_4_ * auVar69._4_4_;
                              auVar131._8_4_ = auVar87._8_4_ * auVar69._8_4_;
                              auVar131._12_4_ = auVar87._12_4_ * auVar69._12_4_;
                              auVar58 = vfmsub231ps_fma(auVar131,auVar68,auVar91);
                              auVar92._0_4_ = auVar90._0_4_ * auVar91._0_4_;
                              auVar92._4_4_ = auVar90._4_4_ * auVar91._4_4_;
                              auVar92._8_4_ = auVar90._8_4_ * auVar91._8_4_;
                              auVar92._12_4_ = auVar90._12_4_ * auVar91._12_4_;
                              auVar80 = vfmsub231ps_fma(auVar92,auVar87,auVar51);
                              auVar52._0_4_ = auVar68._0_4_ * auVar51._0_4_;
                              auVar52._4_4_ = auVar68._4_4_ * auVar51._4_4_;
                              auVar52._8_4_ = auVar68._8_4_ * auVar51._8_4_;
                              auVar52._12_4_ = auVar68._12_4_ * auVar51._12_4_;
                              auVar154 = vfmsub231ps_fma(auVar52,auVar90,auVar69);
                              auVar53._0_4_ = fVar187 * auVar154._0_4_;
                              auVar53._4_4_ = fVar192 * auVar154._4_4_;
                              auVar53._8_4_ = fVar194 * auVar154._8_4_;
                              auVar53._12_4_ = fVar196 * auVar154._12_4_;
                              auVar80 = vfmadd231ps_fma(auVar53,local_1b78,auVar80);
                              auVar154 = vfmadd231ps_fma(auVar80,auVar59,auVar58);
                              auVar162._0_8_ =
                                   CONCAT44(auVar154._4_4_ + auVar116._4_4_ + auVar117._4_4_,
                                            auVar154._0_4_ + auVar116._0_4_ + auVar117._0_4_);
                              auVar162._8_4_ = auVar154._8_4_ + auVar116._8_4_ + auVar117._8_4_;
                              auVar162._12_4_ = auVar154._12_4_ + auVar116._12_4_ + auVar117._12_4_;
                              auVar80 = vandps_avx(auVar162,auVar201);
                              auVar70._0_4_ = auVar80._0_4_ * 1.1920929e-07;
                              auVar70._4_4_ = auVar80._4_4_ * 1.1920929e-07;
                              auVar70._8_4_ = auVar80._8_4_ * 1.1920929e-07;
                              auVar70._12_4_ = auVar80._12_4_ * 1.1920929e-07;
                              auVar80 = vminps_avx(auVar116,auVar117);
                              auVar80 = vminps_avx(auVar80,auVar154);
                              uVar34 = CONCAT44(auVar70._4_4_,auVar70._0_4_);
                              auVar132._0_8_ = uVar34 ^ 0x8000000080000000;
                              auVar132._8_4_ = -auVar70._8_4_;
                              auVar132._12_4_ = -auVar70._12_4_;
                              auVar80 = vcmpps_avx(auVar80,auVar132,5);
                              auVar58 = vmaxps_avx(auVar116,auVar117);
                              auVar58 = vmaxps_avx(auVar58,auVar154);
                              auVar58 = vcmpps_avx(auVar58,auVar70,2);
                              auVar80 = vorps_avx(auVar80,auVar58);
                              auVar58 = auVar67 & auVar80;
                              auVar80 = vandps_avx(auVar80,auVar67);
                              if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar58 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar58 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || auVar58[0xf] < '\0') {
                                auVar54._0_4_ = fVar6 * auVar50._0_4_;
                                auVar54._4_4_ = fVar11 * auVar50._4_4_;
                                auVar54._8_4_ = fVar13 * auVar50._8_4_;
                                auVar54._12_4_ = fVar15 * auVar50._12_4_;
                                auVar207._0_4_ = fVar5 * auVar17._0_4_;
                                auVar207._4_4_ = fVar7 * auVar17._4_4_;
                                auVar207._8_4_ = fVar12 * auVar17._8_4_;
                                auVar207._12_4_ = fVar14 * auVar17._12_4_;
                                auVar49 = vfmsub213ps_fma(auVar17,auVar86,auVar54);
                                auVar93._0_4_ = auVar68._0_4_ * fVar186;
                                auVar93._4_4_ = auVar68._4_4_ * fVar191;
                                auVar93._8_4_ = auVar68._8_4_ * fVar193;
                                auVar93._12_4_ = auVar68._12_4_ * fVar195;
                                auVar133._0_4_ = fVar5 * auVar87._0_4_;
                                auVar133._4_4_ = fVar7 * auVar87._4_4_;
                                auVar133._8_4_ = fVar12 * auVar87._8_4_;
                                auVar133._12_4_ = fVar14 * auVar87._12_4_;
                                auVar87 = vfmsub213ps_fma(auVar87,auVar89,auVar93);
                                auVar58 = vandps_avx(auVar54,auVar201);
                                auVar154 = vandps_avx(auVar93,auVar201);
                                auVar58 = vcmpps_avx(auVar58,auVar154,1);
                                auVar87 = vblendvps_avx(auVar87,auVar49,auVar58);
                                auVar55._0_4_ = auVar90._0_4_ * fVar6;
                                auVar55._4_4_ = auVar90._4_4_ * fVar11;
                                auVar55._8_4_ = auVar90._8_4_ * fVar13;
                                auVar55._12_4_ = auVar90._12_4_ * fVar15;
                                auVar86 = vfmsub213ps_fma(auVar90,auVar86,auVar133);
                                auVar163._0_4_ = auVar88._0_4_ * fVar186;
                                auVar163._4_4_ = auVar88._4_4_ * fVar191;
                                auVar163._8_4_ = auVar88._8_4_ * fVar193;
                                auVar163._12_4_ = auVar88._12_4_ * fVar195;
                                auVar49 = vfmsub213ps_fma(auVar50,auVar115,auVar163);
                                auVar58 = vandps_avx(auVar163,auVar201);
                                auVar154 = vandps_avx(auVar133,auVar201);
                                auVar58 = vcmpps_avx(auVar58,auVar154,1);
                                auVar86 = vblendvps_avx(auVar86,auVar49,auVar58);
                                auVar49 = vfmsub213ps_fma(auVar88,auVar89,auVar207);
                                auVar68 = vfmsub213ps_fma(auVar68,auVar115,auVar55);
                                auVar58 = vandps_avx(auVar207,auVar201);
                                auVar154 = vandps_avx(auVar55,auVar201);
                                auVar58 = vcmpps_avx(auVar58,auVar154,1);
                                auVar154 = vblendvps_avx(auVar68,auVar49,auVar58);
                                local_1a68 = auVar23._0_4_;
                                fStack_1a64 = auVar23._4_4_;
                                fStack_1a60 = auVar23._8_4_;
                                auVar56._0_4_ = auVar154._0_4_ * local_1a68;
                                auVar56._4_4_ = auVar154._4_4_ * fStack_1a64;
                                auVar56._8_4_ = auVar154._8_4_ * fStack_1a60;
                                auVar56._12_4_ = auVar154._12_4_ * fVar196;
                                auVar58 = vfmadd213ps_fma(local_1b78,auVar86,auVar56);
                                auVar58 = vfmadd213ps_fma(auVar59,auVar87,auVar58);
                                auVar57._0_4_ = auVar58._0_4_ + auVar58._0_4_;
                                auVar57._4_4_ = auVar58._4_4_ + auVar58._4_4_;
                                auVar57._8_4_ = auVar58._8_4_ + auVar58._8_4_;
                                auVar57._12_4_ = auVar58._12_4_ + auVar58._12_4_;
                                auVar71._0_4_ = auVar154._0_4_ * fVar84;
                                auVar71._4_4_ = auVar154._4_4_ * fVar2;
                                auVar71._8_4_ = auVar154._8_4_ * fVar3;
                                auVar71._12_4_ = auVar154._12_4_ * fVar4;
                                auVar58 = vfmadd213ps_fma(auVar198,auVar86,auVar71);
                                auVar59 = vfmadd213ps_fma(auVar197,auVar87,auVar58);
                                auVar58 = vrcpps_avx(auVar57);
                                auVar184._8_4_ = 0x3f800000;
                                auVar184._0_8_ = &DAT_3f8000003f800000;
                                auVar184._12_4_ = 0x3f800000;
                                auVar197 = vfnmadd213ps_fma(auVar58,auVar57,auVar184);
                                auVar58 = vfmadd132ps_fma(auVar197,auVar58,auVar58);
                                auVar72._0_4_ = auVar58._0_4_ * (auVar59._0_4_ + auVar59._0_4_);
                                auVar72._4_4_ = auVar58._4_4_ * (auVar59._4_4_ + auVar59._4_4_);
                                auVar72._8_4_ = auVar58._8_4_ * (auVar59._8_4_ + auVar59._8_4_);
                                auVar72._12_4_ = auVar58._12_4_ * (auVar59._12_4_ + auVar59._12_4_);
                                auVar58 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar72,2);
                                auVar59 = vcmpps_avx(auVar72,*(undefined1 (*) [16])(ray + 0x80),2);
                                auVar58 = vandps_avx(auVar59,auVar58);
                                uVar34 = CONCAT44(auVar57._4_4_,auVar57._0_4_);
                                auVar180._0_8_ = uVar34 ^ 0x8000000080000000;
                                auVar180._8_4_ = -auVar57._8_4_;
                                auVar180._12_4_ = -auVar57._12_4_;
                                auVar59 = vcmpps_avx(auVar180,auVar57,4);
                                auVar58 = vandps_avx(auVar59,auVar58);
                                auVar58 = vpslld_avx(auVar58,0x1f);
                                auVar59 = vpsrad_avx(auVar58,0x1f);
                                auVar58 = auVar80 & auVar59;
                                auVar80 = vandps_avx(auVar59,auVar80);
                                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar58 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar58 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar58[0xf] < '\0') {
                                  _local_1838 = auVar116;
                                  _local_1848 = auVar117;
                                  uStack_1a90 = auVar162._8_8_;
                                  local_1858 = auVar162._0_8_;
                                  uStack_1850 = uStack_1a90;
                                  local_1868 = auVar72;
                                  local_1878 = auVar87;
                                  local_1888 = auVar86;
                                  local_1898 = auVar154;
                                }
                              }
                              auVar212 = ZEXT1664(CONCAT412(0x7f800000,
                                                            CONCAT48(0x7f800000,0x7f8000007f800000))
                                                 );
                              uVar30 = *(undefined4 *)(local_1b98 + lVar29 + 0x30);
                              local_1b68._4_4_ = uVar30;
                              local_1b68._0_4_ = uVar30;
                              local_1b68._8_4_ = uVar30;
                              local_1b68._12_4_ = uVar30;
                              fVar84 = *(float *)(local_1b90 + lVar29 + 0x30);
                              fVar2 = *(float *)(local_1b88 + lVar29 + 0x30);
                              uVar30 = *(undefined4 *)(local_1ba0 + lVar29);
                              auVar199._4_4_ = uVar30;
                              auVar199._0_4_ = uVar30;
                              auVar199._8_4_ = uVar30;
                              auVar199._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(local_1bb0 + lVar29);
                              local_1b48._4_4_ = uVar30;
                              local_1b48._0_4_ = uVar30;
                              local_1b48._8_4_ = uVar30;
                              local_1b48._12_4_ = uVar30;
                              uVar30 = *(undefined4 *)(local_1ba8 + lVar29);
                              local_1b58._4_4_ = uVar30;
                              local_1b58._0_4_ = uVar30;
                              local_1b58._8_4_ = uVar30;
                              local_1b58._12_4_ = uVar30;
                              uVar18 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                              pGVar9 = (context->scene->geometries).items[uVar18].ptr;
                              uVar26 = pGVar9->mask;
                              auVar73._4_4_ = uVar26;
                              auVar73._0_4_ = uVar26;
                              auVar73._8_4_ = uVar26;
                              auVar73._12_4_ = uVar26;
                              auVar58 = vpand_avx(auVar73,*(undefined1 (*) [16])(ray + 0x90));
                              auVar58 = vpcmpeqd_avx(auVar58,_DAT_01feba10);
                              auVar154 = auVar80 & ~auVar58;
                              auVar59 = local_1b68;
                              auVar197 = local_1b48;
                              auVar198 = local_1b58;
                              if ((((auVar154 >> 0x1f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0 ||
                                   (auVar154 >> 0x3f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar154 >> 0x5f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) || auVar154[0xf] < '\0') {
                                uVar30 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                                auVar80 = vandnps_avx(auVar58,auVar80);
                                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                   (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                  auVar19._8_8_ = uStack_1850;
                                  auVar19._0_8_ = local_1858;
                                  auVar58 = vandps_avx(auVar19,auVar201);
                                  auVar154 = vrcpps_avx(auVar19);
                                  auVar167._8_4_ = 0x3f800000;
                                  auVar167._0_8_ = &DAT_3f8000003f800000;
                                  auVar167._12_4_ = 0x3f800000;
                                  auVar59 = vfnmadd213ps_fma(auVar154,auVar19,auVar167);
                                  auVar154 = vfmadd132ps_fma(auVar59,auVar154,auVar154);
                                  auVar99._8_4_ = 0x219392ef;
                                  auVar99._0_8_ = 0x219392ef219392ef;
                                  auVar99._12_4_ = 0x219392ef;
                                  auVar58 = vcmpps_avx(auVar58,auVar99,5);
                                  auVar58 = vandps_avx(auVar58,auVar154);
                                  auVar81._0_4_ = auVar58._0_4_ * (float)local_1838._0_4_;
                                  auVar81._4_4_ = auVar58._4_4_ * (float)local_1838._4_4_;
                                  auVar81._8_4_ = auVar58._8_4_ * fStack_1830;
                                  auVar81._12_4_ = auVar58._12_4_ * fStack_182c;
                                  auVar59 = vminps_avx(auVar81,auVar167);
                                  auVar100._0_4_ = auVar58._0_4_ * (float)local_1848._0_4_;
                                  auVar100._4_4_ = auVar58._4_4_ * (float)local_1848._4_4_;
                                  auVar100._8_4_ = auVar58._8_4_ * fStack_1840;
                                  auVar100._12_4_ = auVar58._12_4_ * fStack_183c;
                                  auVar197 = vminps_avx(auVar100,auVar167);
                                  uVar8 = *(undefined4 *)(pGVar40 + lVar29 + -4);
                                  auVar122._4_4_ = uVar8;
                                  auVar122._0_4_ = uVar8;
                                  auVar122._8_4_ = uVar8;
                                  auVar122._12_4_ = uVar8;
                                  uVar8 = *(undefined4 *)(pGVar31 + lVar29 + 0x2c);
                                  auVar137._4_4_ = uVar8;
                                  auVar137._0_4_ = uVar8;
                                  auVar137._8_4_ = uVar8;
                                  auVar137._12_4_ = uVar8;
                                  auVar154 = vpsrld_avx(auVar122,0x10);
                                  auVar86 = ZEXT816(0) << 0x40;
                                  auVar58 = vpblendw_avx(auVar122,auVar86,0xaa);
                                  auVar58 = vcvtdq2ps_avx(auVar58);
                                  auVar154 = vcvtdq2ps_avx(auVar154);
                                  auVar198 = vsubps_avx(auVar167,auVar59);
                                  auVar198 = vsubps_avx(auVar198,auVar197);
                                  auVar175._0_4_ = auVar198._0_4_ * auVar58._0_4_ * 0.00012207031;
                                  auVar175._4_4_ = auVar198._4_4_ * auVar58._4_4_ * 0.00012207031;
                                  auVar175._8_4_ = auVar198._8_4_ * auVar58._8_4_ * 0.00012207031;
                                  auVar175._12_4_ = auVar198._12_4_ * auVar58._12_4_ * 0.00012207031
                                  ;
                                  auVar123._0_4_ = auVar198._0_4_ * auVar154._0_4_ * 0.00012207031;
                                  auVar123._4_4_ = auVar198._4_4_ * auVar154._4_4_ * 0.00012207031;
                                  auVar123._8_4_ = auVar198._8_4_ * auVar154._8_4_ * 0.00012207031;
                                  auVar123._12_4_ =
                                       auVar198._12_4_ * auVar154._12_4_ * 0.00012207031;
                                  auVar58 = vpblendw_avx(auVar137,auVar86,0xaa);
                                  auVar58 = vcvtdq2ps_avx(auVar58);
                                  auVar153._0_4_ = auVar58._0_4_ * 0.00012207031;
                                  auVar153._4_4_ = auVar58._4_4_ * 0.00012207031;
                                  auVar153._8_4_ = auVar58._8_4_ * 0.00012207031;
                                  auVar153._12_4_ = auVar58._12_4_ * 0.00012207031;
                                  auVar154 = vfmadd231ps_fma(auVar175,auVar197,auVar153);
                                  auVar58 = vpsrld_avx(auVar137,0x10);
                                  auVar58 = vcvtdq2ps_avx(auVar58);
                                  auVar138._0_4_ = auVar58._0_4_ * 0.00012207031;
                                  auVar138._4_4_ = auVar58._4_4_ * 0.00012207031;
                                  auVar138._8_4_ = auVar58._8_4_ * 0.00012207031;
                                  auVar138._12_4_ = auVar58._12_4_ * 0.00012207031;
                                  auVar197 = vfmadd231ps_fma(auVar123,auVar197,auVar138);
                                  uVar8 = *(undefined4 *)(pGVar40 + lVar29);
                                  auVar101._4_4_ = uVar8;
                                  auVar101._0_4_ = uVar8;
                                  auVar101._8_4_ = uVar8;
                                  auVar101._12_4_ = uVar8;
                                  auVar58 = vpblendw_avx(auVar101,auVar86,0xaa);
                                  auVar58 = vcvtdq2ps_avx(auVar58);
                                  auVar139._0_4_ = auVar58._0_4_ * 0.00012207031;
                                  auVar139._4_4_ = auVar58._4_4_ * 0.00012207031;
                                  auVar139._8_4_ = auVar58._8_4_ * 0.00012207031;
                                  auVar139._12_4_ = auVar58._12_4_ * 0.00012207031;
                                  local_19c8 = vfmadd231ps_fma(auVar154,auVar59,auVar139);
                                  auVar58 = vpsrld_avx(auVar101,0x10);
                                  auVar58 = vcvtdq2ps_avx(auVar58);
                                  auVar102._0_4_ = auVar58._0_4_ * 0.00012207031;
                                  auVar102._4_4_ = auVar58._4_4_ * 0.00012207031;
                                  auVar102._8_4_ = auVar58._8_4_ * 0.00012207031;
                                  auVar102._12_4_ = auVar58._12_4_ * 0.00012207031;
                                  local_19b8 = vfmadd231ps_fma(auVar197,auVar59,auVar102);
                                  local_19f8 = local_1878._0_8_;
                                  uStack_19f0 = local_1878._8_8_;
                                  local_19e8 = local_1888._0_8_;
                                  uStack_19e0 = local_1888._8_8_;
                                  local_19d8 = local_1898._0_8_;
                                  uStack_19d0 = local_1898._8_8_;
                                  local_1998._4_4_ = uVar18;
                                  local_1998._0_4_ = uVar18;
                                  local_1998._8_4_ = uVar18;
                                  local_1998._12_4_ = uVar18;
                                  local_19a8._4_4_ = uVar30;
                                  local_19a8._0_4_ = uVar30;
                                  local_19a8._8_4_ = uVar30;
                                  local_19a8._12_4_ = uVar30;
                                  vpcmpeqd_avx2(ZEXT1632(local_1998),ZEXT1632(local_1998));
                                  uStack_1984 = context->user->instID[0];
                                  local_1988 = uStack_1984;
                                  uStack_1980 = uStack_1984;
                                  uStack_197c = uStack_1984;
                                  uStack_1978 = context->user->instPrimID[0];
                                  uStack_1974 = uStack_1978;
                                  uStack_1970 = uStack_1978;
                                  uStack_196c = uStack_1978;
                                  local_1b78 = *(undefined1 (*) [16])(ray + 0x80);
                                  auVar58 = vblendvps_avx(local_1b78,local_1868,auVar80);
                                  *(undefined1 (*) [16])(ray + 0x80) = auVar58;
                                  args.valid = (int *)local_1bd8;
                                  args.geometryUserPtr = pGVar9->userPtr;
                                  args.context = context->user;
                                  args.hit = (RTCHitN *)&local_19f8;
                                  args.N = 4;
                                  local_1bd8 = auVar80;
                                  args.ray = (RTCRayN *)ray;
                                  if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                    (*pGVar9->occlusionFilterN)(&args);
                                    auVar212 = ZEXT1664(CONCAT412(0x7f800000,
                                                                  CONCAT48(0x7f800000,
                                                                           0x7f8000007f800000)));
                                  }
                                  if (local_1bd8 == (undefined1  [16])0x0) {
                                    auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                    auVar80 = auVar80 ^ _DAT_01febe20;
                                  }
                                  else {
                                    p_Var10 = context->args->filter;
                                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                       (((context->args->flags &
                                         RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                      (*p_Var10)(&args);
                                      auVar212 = ZEXT1664(CONCAT412(0x7f800000,
                                                                    CONCAT48(0x7f800000,
                                                                             0x7f8000007f800000)));
                                    }
                                    auVar58 = vpcmpeqd_avx((undefined1  [16])0x0,local_1bd8);
                                    auVar80 = auVar58 ^ _DAT_01febe20;
                                    auVar103._8_4_ = 0xff800000;
                                    auVar103._0_8_ = 0xff800000ff800000;
                                    auVar103._12_4_ = 0xff800000;
                                    auVar58 = vblendvps_avx(auVar103,*(undefined1 (*) [16])
                                                                      (args.ray + 0x80),auVar58);
                                    *(undefined1 (*) [16])(args.ray + 0x80) = auVar58;
                                  }
                                  auVar58 = vpslld_avx(auVar80,0x1f);
                                  auVar80 = vpsrad_avx(auVar58,0x1f);
                                  auVar58 = vblendvps_avx(local_1b78,
                                                          *(undefined1 (*) [16])local_1bc0,auVar58);
                                  *(undefined1 (*) [16])local_1bc0 = auVar58;
                                  auVar88 = local_1b68;
                                  auVar17 = local_1b58;
                                  auVar50 = local_1b48;
                                  auVar59 = local_1b68;
                                  auVar197 = local_1b48;
                                  auVar198 = local_1b58;
                                }
                                local_1b48 = auVar50;
                                local_1b58 = auVar17;
                                local_1b68 = auVar88;
                                auVar67 = vpandn_avx(auVar80,auVar67);
                                auVar88 = local_1b68;
                                auVar17 = local_1b58;
                                auVar50 = local_1b48;
                              }
                              local_1b48 = auVar50;
                              local_1b58 = auVar17;
                              local_1b68 = auVar88;
                              if ((((auVar67 >> 0x1f & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0 &&
                                   (auVar67 >> 0x3f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar67 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && -1 < auVar67[0xf]) {
                                bVar48 = false;
                              }
                              else {
                                auVar60._0_4_ = auVar59._0_4_ * local_1a18;
                                auVar60._4_4_ = auVar59._4_4_ * fStack_1a14;
                                auVar60._8_4_ = auVar59._8_4_ * fStack_1a10;
                                auVar60._12_4_ = auVar59._12_4_ * fStack_1a0c;
                                auVar74._0_4_ = local_1a18 * fVar84;
                                auVar74._4_4_ = fStack_1a14 * fVar84;
                                auVar74._8_4_ = fStack_1a10 * fVar84;
                                auVar74._12_4_ = fStack_1a0c * fVar84;
                                auVar94._0_4_ = local_1a18 * fVar2;
                                auVar94._4_4_ = fStack_1a14 * fVar2;
                                auVar94._8_4_ = fStack_1a10 * fVar2;
                                auVar94._12_4_ = fStack_1a0c * fVar2;
                                auVar49 = vfmadd213ps_fma(auVar199,auVar66,auVar60);
                                auVar17 = vfmadd213ps_fma(auVar197,auVar66,auVar74);
                                auVar50 = vfmadd213ps_fma(auVar198,auVar66,auVar94);
                                auVar80 = *(undefined1 (*) [16])ray;
                                auVar58 = *(undefined1 (*) [16])(ray + 0x10);
                                auVar154 = *(undefined1 (*) [16])(ray + 0x20);
                                auVar197 = vsubps_avx(local_1808,auVar80);
                                auVar198 = vsubps_avx(local_1818,auVar58);
                                local_1b48 = vsubps_avx(local_1828,auVar154);
                                auVar59 = vsubps_avx(auVar130,auVar80);
                                auVar86 = vsubps_avx(local_17f8,auVar58);
                                auVar87 = vsubps_avx(auVar145,auVar154);
                                auVar49 = vsubps_avx(auVar49,auVar80);
                                auVar17 = vsubps_avx(auVar17,auVar58);
                                auVar154 = vsubps_avx(auVar50,auVar154);
                                local_1b58 = vsubps_avx(auVar49,auVar197);
                                local_1b78 = vsubps_avx(auVar17,auVar198);
                                local_1b68 = vsubps_avx(auVar154,local_1b48);
                                auVar120._0_4_ = auVar49._0_4_ + auVar197._0_4_;
                                auVar120._4_4_ = auVar49._4_4_ + auVar197._4_4_;
                                auVar120._8_4_ = auVar49._8_4_ + auVar197._8_4_;
                                auVar120._12_4_ = auVar49._12_4_ + auVar197._12_4_;
                                auVar164._0_4_ = auVar17._0_4_ + auVar198._0_4_;
                                auVar164._4_4_ = auVar17._4_4_ + auVar198._4_4_;
                                auVar164._8_4_ = auVar17._8_4_ + auVar198._8_4_;
                                auVar164._12_4_ = auVar17._12_4_ + auVar198._12_4_;
                                fVar186 = local_1b48._0_4_;
                                auVar181._0_4_ = fVar186 + auVar154._0_4_;
                                fVar191 = local_1b48._4_4_;
                                auVar181._4_4_ = fVar191 + auVar154._4_4_;
                                fVar193 = local_1b48._8_4_;
                                auVar181._8_4_ = fVar193 + auVar154._8_4_;
                                fVar195 = local_1b48._12_4_;
                                auVar181._12_4_ = fVar195 + auVar154._12_4_;
                                auVar200._0_4_ = local_1b68._0_4_ * auVar164._0_4_;
                                auVar200._4_4_ = local_1b68._4_4_ * auVar164._4_4_;
                                auVar200._8_4_ = local_1b68._8_4_ * auVar164._8_4_;
                                auVar200._12_4_ = local_1b68._12_4_ * auVar164._12_4_;
                                auVar68 = vfmsub231ps_fma(auVar200,local_1b78,auVar181);
                                auVar190._0_4_ = auVar181._0_4_ * local_1b58._0_4_;
                                auVar190._4_4_ = auVar181._4_4_ * local_1b58._4_4_;
                                auVar190._8_4_ = auVar181._8_4_ * local_1b58._8_4_;
                                auVar190._12_4_ = auVar181._12_4_ * local_1b58._12_4_;
                                auVar58 = vfmsub231ps_fma(auVar190,local_1b68,auVar120);
                                auVar121._0_4_ = auVar120._0_4_ * local_1b78._0_4_;
                                auVar121._4_4_ = auVar120._4_4_ * local_1b78._4_4_;
                                auVar121._8_4_ = auVar120._8_4_ * local_1b78._8_4_;
                                auVar121._12_4_ = auVar120._12_4_ * local_1b78._12_4_;
                                auVar80 = vfmsub231ps_fma(auVar121,local_1b58,auVar164);
                                fVar12 = *(float *)(ray + 0x60);
                                fVar13 = *(float *)(ray + 100);
                                fVar14 = *(float *)(ray + 0x68);
                                auVar23 = *(undefined1 (*) [12])(ray + 0x60);
                                fVar15 = *(float *)(ray + 0x6c);
                                auVar206._0_4_ = fVar12 * auVar80._0_4_;
                                auVar206._4_4_ = fVar13 * auVar80._4_4_;
                                auVar206._8_4_ = fVar14 * auVar80._8_4_;
                                auVar206._12_4_ = fVar15 * auVar80._12_4_;
                                auVar80 = *(undefined1 (*) [16])(ray + 0x50);
                                auVar50 = vfmadd231ps_fma(auVar206,auVar80,auVar58);
                                auVar58 = *(undefined1 (*) [16])(ray + 0x40);
                                auVar115 = vfmadd231ps_fma(auVar50,auVar58,auVar68);
                                auVar50 = vsubps_avx(auVar198,auVar86);
                                auVar68 = vsubps_avx(local_1b48,auVar87);
                                auVar165._0_4_ = auVar198._0_4_ + auVar86._0_4_;
                                auVar165._4_4_ = auVar198._4_4_ + auVar86._4_4_;
                                auVar165._8_4_ = auVar198._8_4_ + auVar86._8_4_;
                                auVar165._12_4_ = auVar198._12_4_ + auVar86._12_4_;
                                auVar210._0_4_ = fVar186 + auVar87._0_4_;
                                auVar210._4_4_ = fVar191 + auVar87._4_4_;
                                auVar210._8_4_ = fVar193 + auVar87._8_4_;
                                auVar210._12_4_ = fVar195 + auVar87._12_4_;
                                fVar187 = auVar68._0_4_;
                                auVar148._0_4_ = fVar187 * auVar165._0_4_;
                                fVar192 = auVar68._4_4_;
                                auVar148._4_4_ = fVar192 * auVar165._4_4_;
                                fVar194 = auVar68._8_4_;
                                auVar148._8_4_ = fVar194 * auVar165._8_4_;
                                fVar196 = auVar68._12_4_;
                                auVar148._12_4_ = fVar196 * auVar165._12_4_;
                                auVar90 = vfmsub231ps_fma(auVar148,auVar50,auVar210);
                                auVar88 = vsubps_avx(auVar197,auVar59);
                                fVar84 = auVar88._0_4_;
                                auVar211._0_4_ = auVar210._0_4_ * fVar84;
                                fVar3 = auVar88._4_4_;
                                auVar211._4_4_ = auVar210._4_4_ * fVar3;
                                fVar5 = auVar88._8_4_;
                                auVar211._8_4_ = auVar210._8_4_ * fVar5;
                                fVar7 = auVar88._12_4_;
                                auVar211._12_4_ = auVar210._12_4_ * fVar7;
                                auVar173._0_4_ = auVar59._0_4_ + auVar197._0_4_;
                                auVar173._4_4_ = auVar59._4_4_ + auVar197._4_4_;
                                auVar173._8_4_ = auVar59._8_4_ + auVar197._8_4_;
                                auVar173._12_4_ = auVar59._12_4_ + auVar197._12_4_;
                                auVar89 = vfmsub231ps_fma(auVar211,auVar68,auVar173);
                                fVar2 = auVar50._0_4_;
                                auVar174._0_4_ = auVar173._0_4_ * fVar2;
                                fVar4 = auVar50._4_4_;
                                auVar174._4_4_ = auVar173._4_4_ * fVar4;
                                fVar6 = auVar50._8_4_;
                                auVar174._8_4_ = auVar173._8_4_ * fVar6;
                                fVar11 = auVar50._12_4_;
                                auVar174._12_4_ = auVar173._12_4_ * fVar11;
                                auVar130 = vfmsub231ps_fma(auVar174,auVar88,auVar165);
                                auVar166._0_4_ = fVar12 * auVar130._0_4_;
                                auVar166._4_4_ = fVar13 * auVar130._4_4_;
                                auVar166._8_4_ = fVar14 * auVar130._8_4_;
                                auVar166._12_4_ = fVar15 * auVar130._12_4_;
                                auVar89 = vfmadd231ps_fma(auVar166,auVar80,auVar89);
                                auVar90 = vfmadd231ps_fma(auVar89,auVar58,auVar90);
                                auVar89 = vsubps_avx(auVar59,auVar49);
                                auVar75._0_4_ = auVar59._0_4_ + auVar49._0_4_;
                                auVar75._4_4_ = auVar59._4_4_ + auVar49._4_4_;
                                auVar75._8_4_ = auVar59._8_4_ + auVar49._8_4_;
                                auVar75._12_4_ = auVar59._12_4_ + auVar49._12_4_;
                                auVar49 = vsubps_avx(auVar86,auVar17);
                                auVar61._0_4_ = auVar17._0_4_ + auVar86._0_4_;
                                auVar61._4_4_ = auVar17._4_4_ + auVar86._4_4_;
                                auVar61._8_4_ = auVar17._8_4_ + auVar86._8_4_;
                                auVar61._12_4_ = auVar17._12_4_ + auVar86._12_4_;
                                auVar86 = vsubps_avx(auVar87,auVar154);
                                auVar95._0_4_ = auVar87._0_4_ + auVar154._0_4_;
                                auVar95._4_4_ = auVar87._4_4_ + auVar154._4_4_;
                                auVar95._8_4_ = auVar87._8_4_ + auVar154._8_4_;
                                auVar95._12_4_ = auVar87._12_4_ + auVar154._12_4_;
                                auVar134._0_4_ = auVar86._0_4_ * auVar61._0_4_;
                                auVar134._4_4_ = auVar86._4_4_ * auVar61._4_4_;
                                auVar134._8_4_ = auVar86._8_4_ * auVar61._8_4_;
                                auVar134._12_4_ = auVar86._12_4_ * auVar61._12_4_;
                                auVar59 = vfmsub231ps_fma(auVar134,auVar49,auVar95);
                                auVar96._0_4_ = auVar89._0_4_ * auVar95._0_4_;
                                auVar96._4_4_ = auVar89._4_4_ * auVar95._4_4_;
                                auVar96._8_4_ = auVar89._8_4_ * auVar95._8_4_;
                                auVar96._12_4_ = auVar89._12_4_ * auVar95._12_4_;
                                auVar154 = vfmsub231ps_fma(auVar96,auVar86,auVar75);
                                auVar76._0_4_ = auVar49._0_4_ * auVar75._0_4_;
                                auVar76._4_4_ = auVar49._4_4_ * auVar75._4_4_;
                                auVar76._8_4_ = auVar49._8_4_ * auVar75._8_4_;
                                auVar76._12_4_ = auVar49._12_4_ * auVar75._12_4_;
                                auVar87 = vfmsub231ps_fma(auVar76,auVar89,auVar61);
                                auVar62._0_4_ = fVar12 * auVar87._0_4_;
                                auVar62._4_4_ = fVar13 * auVar87._4_4_;
                                auVar62._8_4_ = fVar14 * auVar87._8_4_;
                                auVar62._12_4_ = fVar15 * auVar87._12_4_;
                                auVar154 = vfmadd231ps_fma(auVar62,auVar80,auVar154);
                                auVar87 = vfmadd231ps_fma(auVar154,auVar58,auVar59);
                                auVar149._0_4_ = auVar87._0_4_ + auVar115._0_4_ + auVar90._0_4_;
                                auVar149._4_4_ = auVar87._4_4_ + auVar115._4_4_ + auVar90._4_4_;
                                auVar149._8_4_ = auVar87._8_4_ + auVar115._8_4_ + auVar90._8_4_;
                                auVar149._12_4_ = auVar87._12_4_ + auVar115._12_4_ + auVar90._12_4_;
                                auVar154 = vandps_avx(auVar201,auVar149);
                                auVar77._0_4_ = auVar154._0_4_ * 1.1920929e-07;
                                auVar77._4_4_ = auVar154._4_4_ * 1.1920929e-07;
                                auVar77._8_4_ = auVar154._8_4_ * 1.1920929e-07;
                                auVar77._12_4_ = auVar154._12_4_ * 1.1920929e-07;
                                auVar154 = vminps_avx(auVar115,auVar90);
                                auVar154 = vminps_avx(auVar154,auVar87);
                                uVar34 = CONCAT44(auVar77._4_4_,auVar77._0_4_);
                                auVar135._0_8_ = uVar34 ^ 0x8000000080000000;
                                auVar135._8_4_ = -auVar77._8_4_;
                                auVar135._12_4_ = -auVar77._12_4_;
                                auVar154 = vcmpps_avx(auVar154,auVar135,5);
                                auVar59 = vmaxps_avx(auVar115,auVar90);
                                auVar59 = vmaxps_avx(auVar59,auVar87);
                                auVar59 = vcmpps_avx(auVar59,auVar77,2);
                                auVar154 = vorps_avx(auVar154,auVar59);
                                auVar59 = auVar67 & auVar154;
                                auVar154 = vandps_avx(auVar154,auVar67);
                                if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar59 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar59 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar59[0xf] < '\0') {
                                  auVar63._0_4_ = fVar2 * local_1b68._0_4_;
                                  auVar63._4_4_ = fVar4 * local_1b68._4_4_;
                                  auVar63._8_4_ = fVar6 * local_1b68._8_4_;
                                  auVar63._12_4_ = fVar11 * local_1b68._12_4_;
                                  local_1a98._4_4_ = fVar3 * local_1b78._4_4_;
                                  local_1a98._0_4_ = fVar84 * local_1b78._0_4_;
                                  uStack_1a90._0_4_ = fVar5 * local_1b78._8_4_;
                                  uStack_1a90._4_4_ = fVar7 * local_1b78._12_4_;
                                  auVar87 = vfmsub213ps_fma(local_1b78,auVar68,auVar63);
                                  auVar97._0_4_ = auVar49._0_4_ * fVar187;
                                  auVar97._4_4_ = auVar49._4_4_ * fVar192;
                                  auVar97._8_4_ = auVar49._8_4_ * fVar194;
                                  auVar97._12_4_ = auVar49._12_4_ * fVar196;
                                  auVar136._0_4_ = auVar86._0_4_ * fVar84;
                                  auVar136._4_4_ = auVar86._4_4_ * fVar3;
                                  auVar136._8_4_ = auVar86._8_4_ * fVar5;
                                  auVar136._12_4_ = auVar86._12_4_ * fVar7;
                                  auVar17 = vfmsub213ps_fma(auVar86,auVar50,auVar97);
                                  auVar59 = vandps_avx(auVar201,auVar63);
                                  auVar86 = vandps_avx(auVar201,auVar97);
                                  auVar59 = vcmpps_avx(auVar59,auVar86,1);
                                  auVar87 = vblendvps_avx(auVar17,auVar87,auVar59);
                                  auVar150._0_4_ = auVar89._0_4_ * fVar2;
                                  auVar150._4_4_ = auVar89._4_4_ * fVar4;
                                  auVar150._8_4_ = auVar89._8_4_ * fVar6;
                                  auVar150._12_4_ = auVar89._12_4_ * fVar11;
                                  auVar17 = vfmsub213ps_fma(auVar89,auVar68,auVar136);
                                  auVar98._0_4_ = fVar187 * local_1b58._0_4_;
                                  auVar98._4_4_ = fVar192 * local_1b58._4_4_;
                                  auVar98._8_4_ = fVar194 * local_1b58._8_4_;
                                  auVar98._12_4_ = fVar196 * local_1b58._12_4_;
                                  auVar68 = vfmsub213ps_fma(local_1b68,auVar88,auVar98);
                                  auVar59 = vandps_avx(auVar201,auVar98);
                                  auVar86 = vandps_avx(auVar201,auVar136);
                                  auVar59 = vcmpps_avx(auVar59,auVar86,1);
                                  auVar17 = vblendvps_avx(auVar17,auVar68,auVar59);
                                  auVar50 = vfmsub213ps_fma(local_1b58,auVar50,_local_1a98);
                                  auVar49 = vfmsub213ps_fma(auVar49,auVar88,auVar150);
                                  auVar59 = vandps_avx(auVar201,_local_1a98);
                                  auVar86 = vandps_avx(auVar201,auVar150);
                                  auVar59 = vcmpps_avx(auVar59,auVar86,1);
                                  auVar59 = vblendvps_avx(auVar49,auVar50,auVar59);
                                  local_1c68._0_4_ = auVar23._0_4_;
                                  local_1c68._4_4_ = auVar23._4_4_;
                                  fStack_1c60 = auVar23._8_4_;
                                  auVar78._0_4_ = auVar59._0_4_ * (float)local_1c68._0_4_;
                                  auVar78._4_4_ = auVar59._4_4_ * (float)local_1c68._4_4_;
                                  auVar78._8_4_ = auVar59._8_4_ * fStack_1c60;
                                  auVar78._12_4_ = auVar59._12_4_ * fVar15;
                                  auVar80 = vfmadd213ps_fma(auVar80,auVar17,auVar78);
                                  auVar80 = vfmadd213ps_fma(auVar58,auVar87,auVar80);
                                  auVar79._0_4_ = auVar80._0_4_ + auVar80._0_4_;
                                  auVar79._4_4_ = auVar80._4_4_ + auVar80._4_4_;
                                  auVar79._8_4_ = auVar80._8_4_ + auVar80._8_4_;
                                  auVar79._12_4_ = auVar80._12_4_ + auVar80._12_4_;
                                  auVar151._0_4_ = auVar59._0_4_ * fVar186;
                                  auVar151._4_4_ = auVar59._4_4_ * fVar191;
                                  auVar151._8_4_ = auVar59._8_4_ * fVar193;
                                  auVar151._12_4_ = auVar59._12_4_ * fVar195;
                                  auVar80 = vfmadd213ps_fma(auVar198,auVar17,auVar151);
                                  auVar58 = vfmadd213ps_fma(auVar197,auVar87,auVar80);
                                  auVar80 = vrcpps_avx(auVar79);
                                  auVar185._8_4_ = 0x3f800000;
                                  auVar185._0_8_ = &DAT_3f8000003f800000;
                                  auVar185._12_4_ = 0x3f800000;
                                  auVar197 = vfnmadd213ps_fma(auVar80,auVar79,auVar185);
                                  auVar80 = vfmadd132ps_fma(auVar197,auVar80,auVar80);
                                  auVar152._0_4_ = auVar80._0_4_ * (auVar58._0_4_ + auVar58._0_4_);
                                  auVar152._4_4_ = auVar80._4_4_ * (auVar58._4_4_ + auVar58._4_4_);
                                  auVar152._8_4_ = auVar80._8_4_ * (auVar58._8_4_ + auVar58._8_4_);
                                  auVar152._12_4_ =
                                       auVar80._12_4_ * (auVar58._12_4_ + auVar58._12_4_);
                                  auVar80 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar152,2
                                                      );
                                  auVar58 = vcmpps_avx(auVar152,*(undefined1 (*) [16])(ray + 0x80),2
                                                      );
                                  auVar80 = vandps_avx(auVar58,auVar80);
                                  uVar34 = CONCAT44(auVar79._4_4_,auVar79._0_4_);
                                  auVar182._0_8_ = uVar34 ^ 0x8000000080000000;
                                  auVar182._8_4_ = -auVar79._8_4_;
                                  auVar182._12_4_ = -auVar79._12_4_;
                                  auVar58 = vcmpps_avx(auVar182,auVar79,4);
                                  auVar80 = vandps_avx(auVar58,auVar80);
                                  auVar80 = vpslld_avx(auVar80,0x1f);
                                  auVar58 = vpsrad_avx(auVar80,0x1f);
                                  auVar80 = auVar154 & auVar58;
                                  auVar154 = vandps_avx(auVar58,auVar154);
                                  if ((((auVar80 >> 0x1f & (undefined1  [16])0x1) !=
                                        (undefined1  [16])0x0 ||
                                       (auVar80 >> 0x3f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                      (auVar80 >> 0x5f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) || auVar80[0xf] < '\0') {
                                    _local_18a8 = auVar115;
                                    _local_18b8 = auVar90;
                                    local_18c8 = auVar149;
                                    local_18d8 = auVar152;
                                    local_18e8 = auVar87;
                                    local_18f8 = auVar17;
                                    local_1908 = auVar59;
                                  }
                                }
                                auVar212 = ZEXT1664(CONCAT412(0x7f800000,
                                                              CONCAT48(0x7f800000,0x7f8000007f800000
                                                                      )));
                                uVar18 = *(uint *)(pre.super_Precalculations.grid + 0x18);
                                pGVar9 = (context->scene->geometries).items[uVar18].ptr;
                                uVar26 = pGVar9->mask;
                                auVar64._4_4_ = uVar26;
                                auVar64._0_4_ = uVar26;
                                auVar64._8_4_ = uVar26;
                                auVar64._12_4_ = uVar26;
                                auVar80 = vpand_avx(auVar64,*(undefined1 (*) [16])(ray + 0x90));
                                auVar80 = vpcmpeqd_avx(auVar80,_DAT_01feba10);
                                auVar58 = auVar154 & ~auVar80;
                                if ((((auVar58 >> 0x1f & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar58 >> 0x3f & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar58 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar58[0xf] < '\0') {
                                  uVar30 = *(undefined4 *)(pre.super_Precalculations.grid + 0x1c);
                                  auVar80 = vandnps_avx(auVar80,auVar154);
                                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                     (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                                    auVar58 = vandps_avx(local_18c8,auVar201);
                                    auVar154 = vrcpps_avx(local_18c8);
                                    auVar168._8_4_ = 0x3f800000;
                                    auVar168._0_8_ = &DAT_3f8000003f800000;
                                    auVar168._12_4_ = 0x3f800000;
                                    auVar59 = vfnmadd213ps_fma(auVar154,local_18c8,auVar168);
                                    auVar154 = vfmadd132ps_fma(auVar59,auVar154,auVar154);
                                    auVar104._8_4_ = 0x219392ef;
                                    auVar104._0_8_ = 0x219392ef219392ef;
                                    auVar104._12_4_ = 0x219392ef;
                                    auVar58 = vcmpps_avx(auVar58,auVar104,5);
                                    auVar58 = vandps_avx(auVar58,auVar154);
                                    auVar82._0_4_ = auVar58._0_4_ * (float)local_18a8._0_4_;
                                    auVar82._4_4_ = auVar58._4_4_ * (float)local_18a8._4_4_;
                                    auVar82._8_4_ = auVar58._8_4_ * fStack_18a0;
                                    auVar82._12_4_ = auVar58._12_4_ * fStack_189c;
                                    auVar59 = vminps_avx(auVar82,auVar168);
                                    auVar105._0_4_ = auVar58._0_4_ * (float)local_18b8._0_4_;
                                    auVar105._4_4_ = auVar58._4_4_ * (float)local_18b8._4_4_;
                                    auVar105._8_4_ = auVar58._8_4_ * fStack_18b0;
                                    auVar105._12_4_ = auVar58._12_4_ * fStack_18ac;
                                    auVar197 = vminps_avx(auVar105,auVar168);
                                    uVar8 = *(undefined4 *)(pGVar31 + lVar29 + 0x2c);
                                    auVar124._4_4_ = uVar8;
                                    auVar124._0_4_ = uVar8;
                                    auVar124._8_4_ = uVar8;
                                    auVar124._12_4_ = uVar8;
                                    uVar8 = *(undefined4 *)(pGVar31 + lVar29 + 0x30);
                                    auVar140._4_4_ = uVar8;
                                    auVar140._0_4_ = uVar8;
                                    auVar140._8_4_ = uVar8;
                                    auVar140._12_4_ = uVar8;
                                    auVar154 = vpsrld_avx(auVar124,0x10);
                                    auVar86 = ZEXT816(0) << 0x40;
                                    auVar58 = vpblendw_avx(auVar124,auVar86,0xaa);
                                    auVar58 = vcvtdq2ps_avx(auVar58);
                                    auVar154 = vcvtdq2ps_avx(auVar154);
                                    auVar198 = vsubps_avx(auVar168,auVar59);
                                    auVar198 = vsubps_avx(auVar198,auVar197);
                                    auVar176._0_4_ = auVar198._0_4_ * auVar58._0_4_ * 0.00012207031;
                                    auVar176._4_4_ = auVar198._4_4_ * auVar58._4_4_ * 0.00012207031;
                                    auVar176._8_4_ = auVar198._8_4_ * auVar58._8_4_ * 0.00012207031;
                                    auVar176._12_4_ =
                                         auVar198._12_4_ * auVar58._12_4_ * 0.00012207031;
                                    auVar125._0_4_ = auVar198._0_4_ * auVar154._0_4_ * 0.00012207031
                                    ;
                                    auVar125._4_4_ = auVar198._4_4_ * auVar154._4_4_ * 0.00012207031
                                    ;
                                    auVar125._8_4_ = auVar198._8_4_ * auVar154._8_4_ * 0.00012207031
                                    ;
                                    auVar125._12_4_ =
                                         auVar198._12_4_ * auVar154._12_4_ * 0.00012207031;
                                    auVar58 = vpblendw_avx(auVar140,auVar86,0xaa);
                                    auVar58 = vcvtdq2ps_avx(auVar58);
                                    auVar155._0_4_ = auVar58._0_4_ * 0.00012207031;
                                    auVar155._4_4_ = auVar58._4_4_ * 0.00012207031;
                                    auVar155._8_4_ = auVar58._8_4_ * 0.00012207031;
                                    auVar155._12_4_ = auVar58._12_4_ * 0.00012207031;
                                    auVar154 = vfmadd231ps_fma(auVar176,auVar197,auVar155);
                                    auVar58 = vpsrld_avx(auVar140,0x10);
                                    auVar58 = vcvtdq2ps_avx(auVar58);
                                    auVar141._0_4_ = auVar58._0_4_ * 0.00012207031;
                                    auVar141._4_4_ = auVar58._4_4_ * 0.00012207031;
                                    auVar141._8_4_ = auVar58._8_4_ * 0.00012207031;
                                    auVar141._12_4_ = auVar58._12_4_ * 0.00012207031;
                                    auVar197 = vfmadd231ps_fma(auVar125,auVar197,auVar141);
                                    uVar8 = *(undefined4 *)(pGVar40 + lVar29);
                                    auVar106._4_4_ = uVar8;
                                    auVar106._0_4_ = uVar8;
                                    auVar106._8_4_ = uVar8;
                                    auVar106._12_4_ = uVar8;
                                    auVar58 = vpblendw_avx(auVar106,auVar86,0xaa);
                                    auVar58 = vcvtdq2ps_avx(auVar58);
                                    auVar142._0_4_ = auVar58._0_4_ * 0.00012207031;
                                    auVar142._4_4_ = auVar58._4_4_ * 0.00012207031;
                                    auVar142._8_4_ = auVar58._8_4_ * 0.00012207031;
                                    auVar142._12_4_ = auVar58._12_4_ * 0.00012207031;
                                    local_19c8 = vfmadd231ps_fma(auVar154,auVar59,auVar142);
                                    auVar58 = vpsrld_avx(auVar106,0x10);
                                    auVar58 = vcvtdq2ps_avx(auVar58);
                                    auVar107._0_4_ = auVar58._0_4_ * 0.00012207031;
                                    auVar107._4_4_ = auVar58._4_4_ * 0.00012207031;
                                    auVar107._8_4_ = auVar58._8_4_ * 0.00012207031;
                                    auVar107._12_4_ = auVar58._12_4_ * 0.00012207031;
                                    local_19b8 = vfmadd231ps_fma(auVar197,auVar59,auVar107);
                                    local_19f8 = local_18e8._0_8_;
                                    uStack_19f0 = local_18e8._8_8_;
                                    local_19e8 = local_18f8._0_8_;
                                    uStack_19e0 = local_18f8._8_8_;
                                    local_19d8 = local_1908._0_8_;
                                    uStack_19d0 = local_1908._8_8_;
                                    local_1998._4_4_ = uVar18;
                                    local_1998._0_4_ = uVar18;
                                    local_1998._8_4_ = uVar18;
                                    local_1998._12_4_ = uVar18;
                                    local_19a8._4_4_ = uVar30;
                                    local_19a8._0_4_ = uVar30;
                                    local_19a8._8_4_ = uVar30;
                                    local_19a8._12_4_ = uVar30;
                                    vpcmpeqd_avx2(ZEXT1632(local_1998),ZEXT1632(local_1998));
                                    uStack_1984 = context->user->instID[0];
                                    local_1988 = uStack_1984;
                                    uStack_1980 = uStack_1984;
                                    uStack_197c = uStack_1984;
                                    uStack_1978 = context->user->instPrimID[0];
                                    uStack_1974 = uStack_1978;
                                    uStack_1970 = uStack_1978;
                                    uStack_196c = uStack_1978;
                                    auVar58 = *(undefined1 (*) [16])(ray + 0x80);
                                    auVar154 = vblendvps_avx(auVar58,local_18d8,auVar80);
                                    *(undefined1 (*) [16])(ray + 0x80) = auVar154;
                                    args.valid = (int *)local_1bd8;
                                    args.geometryUserPtr = pGVar9->userPtr;
                                    args.context = context->user;
                                    args.hit = (RTCHitN *)&local_19f8;
                                    args.N = 4;
                                    local_1bd8 = auVar80;
                                    args.ray = (RTCRayN *)ray;
                                    if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                      (*pGVar9->occlusionFilterN)(&args);
                                      auVar212 = ZEXT1664(CONCAT412(0x7f800000,
                                                                    CONCAT48(0x7f800000,
                                                                             0x7f8000007f800000)));
                                    }
                                    if (local_1bd8 == (undefined1  [16])0x0) {
                                      auVar80 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                                      auVar80 = auVar80 ^ _DAT_01febe20;
                                    }
                                    else {
                                      p_Var10 = context->args->filter;
                                      if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                         (((context->args->flags &
                                           RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                                        (*p_Var10)(&args);
                                        auVar212 = ZEXT1664(CONCAT412(0x7f800000,
                                                                      CONCAT48(0x7f800000,
                                                                               0x7f8000007f800000)))
                                        ;
                                      }
                                      auVar154 = vpcmpeqd_avx((undefined1  [16])0x0,local_1bd8);
                                      auVar80 = auVar154 ^ _DAT_01febe20;
                                      auVar108._8_4_ = 0xff800000;
                                      auVar108._0_8_ = 0xff800000ff800000;
                                      auVar108._12_4_ = 0xff800000;
                                      auVar154 = vblendvps_avx(auVar108,*(undefined1 (*) [16])
                                                                         (args.ray + 0x80),auVar154)
                                      ;
                                      *(undefined1 (*) [16])(args.ray + 0x80) = auVar154;
                                    }
                                    auVar154 = vpslld_avx(auVar80,0x1f);
                                    auVar80 = vpsrad_avx(auVar154,0x1f);
                                    auVar58 = vblendvps_avx(auVar58,*(undefined1 (*) [16])local_1bc0
                                                            ,auVar154);
                                    *(undefined1 (*) [16])local_1bc0 = auVar58;
                                  }
                                  auVar67 = vpandn_avx(auVar80,auVar67);
                                }
                                bVar48 = (((auVar67 >> 0x1f & (undefined1  [16])0x1) !=
                                           (undefined1  [16])0x0 ||
                                          (auVar67 >> 0x3f & (undefined1  [16])0x1) !=
                                          (undefined1  [16])0x0) ||
                                         (auVar67 >> 0x5f & (undefined1  [16])0x1) !=
                                         (undefined1  [16])0x0) || auVar67[0xf] < '\0';
                              }
                              auVar208 = ZEXT1664(auVar67);
                              lVar29 = lVar29 + 4;
                            } while (bVar48);
                            if (local_1b7c == 2) break;
                            pGVar31 = pGVar31 + lVar1;
                            local_1b88 = local_1b88 + lVar1;
                            local_1b90 = local_1b90 + lVar1;
                            local_1b98 = local_1b98 + lVar1;
                            local_1ba8 = local_1ba8 + lVar1;
                            local_1bb0 = local_1bb0 + lVar1;
                            local_1ba0 = local_1ba0 + lVar1;
                            pGVar40 = pGVar40 + lVar1;
                            pGVar38 = pGVar38 + lVar1;
                            local_1bb8 = local_1bb8 + lVar1;
                            local_1af0 = local_1af0 + lVar1;
                            local_1af8 = local_1af8 + lVar1;
                            local_1b00 = local_1b00 + lVar1;
                            pGVar44 = pGVar44 + lVar1;
                            bVar48 = local_1b08 == 0;
                            local_1b08 = local_1b08 + 1;
                          } while (bVar48);
                          auVar109._0_4_ = auVar126._0_4_ ^ local_1928._0_4_;
                          auVar109._4_4_ = auVar126._4_4_ ^ local_1928._4_4_;
                          auVar109._8_4_ = auVar126._8_4_ ^ local_1928._8_4_;
                          auVar109._12_4_ = auVar126._12_4_ ^ local_1928._12_4_;
                          auVar126 = vpor_avx(auVar208._0_16_,local_1938);
                          auVar87 = vpand_avx(auVar126,local_1918);
                          uVar26 = vmovmskps_avx(auVar109);
                          auVar126 = auVar109;
                        } while (uVar26 != 0);
                        aVar16 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                                 (auVar87 ^ _DAT_01febe20);
                      }
                      sVar32 = 0;
                    }
                    else {
                      pre.super_Precalculations.grid = *(GridSOA **)(root.ptr & 0xfffffffffffffff0);
                      sVar32 = *(size_t *)pre.super_Precalculations.grid;
                      aVar16 = local_1968;
                    }
                    terminated.field_0 =
                         (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                         vpor_avx((undefined1  [16])aVar16,(undefined1  [16])terminated.field_0);
                    auVar111 = _DAT_01febe20 & ~(undefined1  [16])terminated.field_0;
                    if ((((auVar111 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                         (auVar111 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar111 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar111[0xf]) goto LAB_00550a7e;
                    auVar110._8_4_ = 0xff800000;
                    auVar110._0_8_ = 0xff800000ff800000;
                    auVar110._12_4_ = 0xff800000;
                    tray.tfar.field_0 =
                         (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar110,
                                       (undefined1  [16])terminated.field_0);
                    iVar27 = 0;
                    if (sVar32 != 0) {
                      pNVar45->ptr = sVar32;
                      pNVar45 = pNVar45 + 1;
                      aVar65.i[2] = 0xff800000;
                      aVar65._0_8_ = 0xff800000ff800000;
                      aVar65.i[3] = 0xff800000;
                      *paVar47 = aVar65;
                      paVar47 = paVar47 + 1;
                    }
                    break;
                  }
                  goto LAB_00550a8f;
                }
                uVar28 = root.ptr & 0xfffffffffffffff0;
                auVar111 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar208._0_16_,6);
                auVar208 = ZEXT1664(auVar212._0_16_);
                uVar36 = 0;
                root.ptr = 8;
                do {
                  sVar32 = *(size_t *)(uVar28 + uVar36 * 8);
                  if (sVar32 != 8) {
                    uVar30 = *(undefined4 *)(uVar28 + 0x80 + uVar36 * 4);
                    auVar112._4_4_ = uVar30;
                    auVar112._0_4_ = uVar30;
                    auVar112._8_4_ = uVar30;
                    auVar112._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(uVar28 + 0x20 + uVar36 * 4);
                    auVar85._4_4_ = uVar30;
                    auVar85._0_4_ = uVar30;
                    auVar85._8_4_ = uVar30;
                    auVar85._12_4_ = uVar30;
                    auVar66 = *(undefined1 (*) [16])(ray + 0x70);
                    auVar126 = vfmadd231ps_fma(auVar85,auVar66,auVar112);
                    uVar30 = *(undefined4 *)(uVar28 + 0xa0 + uVar36 * 4);
                    auVar127._4_4_ = uVar30;
                    auVar127._0_4_ = uVar30;
                    auVar127._8_4_ = uVar30;
                    auVar127._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(uVar28 + 0x40 + uVar36 * 4);
                    auVar113._4_4_ = uVar30;
                    auVar113._0_4_ = uVar30;
                    auVar113._8_4_ = uVar30;
                    auVar113._12_4_ = uVar30;
                    auVar80 = vfmadd231ps_fma(auVar113,auVar66,auVar127);
                    uVar30 = *(undefined4 *)(uVar28 + 0xc0 + uVar36 * 4);
                    auVar143._4_4_ = uVar30;
                    auVar143._0_4_ = uVar30;
                    auVar143._8_4_ = uVar30;
                    auVar143._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(uVar28 + 0x60 + uVar36 * 4);
                    auVar128._4_4_ = uVar30;
                    auVar128._0_4_ = uVar30;
                    auVar128._8_4_ = uVar30;
                    auVar128._12_4_ = uVar30;
                    auVar58 = vfmadd231ps_fma(auVar128,auVar66,auVar143);
                    uVar30 = *(undefined4 *)(uVar28 + 0x90 + uVar36 * 4);
                    auVar156._4_4_ = uVar30;
                    auVar156._0_4_ = uVar30;
                    auVar156._8_4_ = uVar30;
                    auVar156._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(uVar28 + 0x30 + uVar36 * 4);
                    auVar144._4_4_ = uVar30;
                    auVar144._0_4_ = uVar30;
                    auVar144._8_4_ = uVar30;
                    auVar144._12_4_ = uVar30;
                    auVar154 = vfmadd231ps_fma(auVar144,auVar66,auVar156);
                    uVar30 = *(undefined4 *)(uVar28 + 0xb0 + uVar36 * 4);
                    auVar157._4_4_ = uVar30;
                    auVar157._0_4_ = uVar30;
                    auVar157._8_4_ = uVar30;
                    auVar157._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(uVar28 + 0x50 + uVar36 * 4);
                    auVar169._4_4_ = uVar30;
                    auVar169._0_4_ = uVar30;
                    auVar169._8_4_ = uVar30;
                    auVar169._12_4_ = uVar30;
                    auVar59 = vfmadd231ps_fma(auVar169,auVar66,auVar157);
                    uVar30 = *(undefined4 *)(uVar28 + 0xd0 + uVar36 * 4);
                    auVar158._4_4_ = uVar30;
                    auVar158._0_4_ = uVar30;
                    auVar158._8_4_ = uVar30;
                    auVar158._12_4_ = uVar30;
                    uVar30 = *(undefined4 *)(uVar28 + 0x70 + uVar36 * 4);
                    auVar177._4_4_ = uVar30;
                    auVar177._0_4_ = uVar30;
                    auVar177._8_4_ = uVar30;
                    auVar177._12_4_ = uVar30;
                    auVar67 = vfmadd231ps_fma(auVar177,auVar66,auVar158);
                    auVar20._4_4_ = tray.org_rdir.field_0._4_4_;
                    auVar20._0_4_ = tray.org_rdir.field_0._0_4_;
                    auVar20._8_4_ = tray.org_rdir.field_0._8_4_;
                    auVar20._12_4_ = tray.org_rdir.field_0._12_4_;
                    auVar197 = vfmsub213ps_fma(auVar126,(undefined1  [16])
                                                        tray.rdir.field_0.field_0.x.field_0,auVar20)
                    ;
                    auVar21._4_4_ = tray.org_rdir.field_0._20_4_;
                    auVar21._0_4_ = tray.org_rdir.field_0._16_4_;
                    auVar21._8_4_ = tray.org_rdir.field_0._24_4_;
                    auVar21._12_4_ = tray.org_rdir.field_0._28_4_;
                    auVar198 = vfmsub213ps_fma(auVar80,(undefined1  [16])
                                                       tray.rdir.field_0.field_0.y.field_0,auVar21);
                    auVar22._4_4_ = tray.org_rdir.field_0._36_4_;
                    auVar22._0_4_ = tray.org_rdir.field_0._32_4_;
                    auVar22._8_4_ = tray.org_rdir.field_0._40_4_;
                    auVar22._12_4_ = tray.org_rdir.field_0._44_4_;
                    auVar86 = vfmsub213ps_fma(auVar58,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0,auVar22);
                    auVar58 = vfmsub213ps_fma(auVar154,(undefined1  [16])
                                                       tray.rdir.field_0.field_0.x.field_0,auVar20);
                    auVar154 = vfmsub213ps_fma(auVar59,(undefined1  [16])
                                                       tray.rdir.field_0.field_0.y.field_0,auVar21);
                    auVar59 = vfmsub213ps_fma(auVar67,(undefined1  [16])
                                                      tray.rdir.field_0.field_0.z.field_0,auVar22);
                    auVar126 = vpminsd_avx(auVar197,auVar58);
                    auVar80 = vpminsd_avx(auVar198,auVar154);
                    auVar126 = vpmaxsd_avx(auVar126,auVar80);
                    auVar80 = vpminsd_avx(auVar86,auVar59);
                    auVar126 = vpmaxsd_avx(auVar126,auVar80);
                    auVar80 = vpmaxsd_avx(auVar197,auVar58);
                    auVar58 = vpmaxsd_avx(auVar198,auVar154);
                    auVar154 = vpminsd_avx(auVar80,auVar58);
                    auVar80 = vpmaxsd_avx(auVar86,auVar59);
                    auVar58 = vpmaxsd_avx(auVar126,(undefined1  [16])tray.tnear.field_0);
                    auVar80 = vpminsd_avx(auVar154,auVar80);
                    auVar80 = vpminsd_avx(auVar80,(undefined1  [16])tray.tfar.field_0);
                    if ((uVar26 & 7) == 6) {
                      auVar80 = vcmpps_avx(auVar58,auVar80,2);
                      uVar30 = *(undefined4 *)(uVar28 + 0xe0 + uVar36 * 4);
                      auVar114._4_4_ = uVar30;
                      auVar114._0_4_ = uVar30;
                      auVar114._8_4_ = uVar30;
                      auVar114._12_4_ = uVar30;
                      auVar58 = vcmpps_avx(auVar114,auVar66,2);
                      uVar30 = *(undefined4 *)(uVar28 + 0xf0 + uVar36 * 4);
                      auVar129._4_4_ = uVar30;
                      auVar129._0_4_ = uVar30;
                      auVar129._8_4_ = uVar30;
                      auVar129._12_4_ = uVar30;
                      auVar66 = vcmpps_avx(auVar66,auVar129,1);
                      auVar66 = vandps_avx(auVar58,auVar66);
                      auVar66 = vandps_avx(auVar66,auVar80);
                    }
                    else {
                      auVar66 = vcmpps_avx(auVar58,auVar80,2);
                    }
                    auVar66 = vandps_avx(auVar66,auVar111);
                    auVar66 = vpslld_avx(auVar66,0x1f);
                    if ((((auVar66 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar66 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar66 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar66[0xf] < '\0') {
                      auVar66 = vblendvps_avx(auVar212._0_16_,auVar126,auVar66);
                      if (root.ptr != 8) {
                        pNVar45->ptr = root.ptr;
                        pNVar45 = pNVar45 + 1;
                        *paVar47 = auVar208._0_16_;
                        paVar47 = paVar47 + 1;
                      }
                      auVar208 = ZEXT1664(auVar66);
                      root.ptr = sVar32;
                    }
                  }
                } while ((sVar32 != 8) && (bVar48 = uVar36 < 3, uVar36 = uVar36 + 1, bVar48));
                iVar27 = 0;
                if (root.ptr == 8) {
LAB_0054f490:
                  bVar48 = false;
                  iVar27 = 4;
                }
                else {
                  auVar111 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                        (undefined1  [16])auVar208._0_16_,6);
                  uVar30 = vmovmskps_avx(auVar111);
                  bVar48 = true;
                  if ((uint)POPCOUNT(uVar30) <= uVar41) {
                    pNVar45->ptr = root.ptr;
                    pNVar45 = pNVar45 + 1;
                    *paVar47 = auVar208._0_16_;
                    paVar47 = paVar47 + 1;
                    goto LAB_0054f490;
                  }
                }
              } while (bVar48);
            }
          }
        }
      } while (iVar27 != 3);
      auVar111 = vandps_avx(local_1958,(undefined1  [16])terminated.field_0);
      auVar83._8_4_ = 0xff800000;
      auVar83._0_8_ = 0xff800000ff800000;
      auVar83._12_4_ = 0xff800000;
      auVar111 = vmaskmovps_avx(auVar111,auVar83);
      *(undefined1 (*) [16])local_1bc0 = auVar111;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }